

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O2

void nhdp_domain_init(oonf_rfc5444_protocol *p)

{
  _protocol = p;
  oonf_class_add(&_domain_class);
  _domain_list.prev = &_domain_list;
  _domain_list.next = &_domain_list;
  _domain_listener_list.prev = &_domain_listener_list;
  _domain_listener_list.next = &_domain_listener_list;
  _domain_metric_postprocessor_list.prev = &_domain_metric_postprocessor_list;
  _domain_metric_postprocessor_list.next = &_domain_metric_postprocessor_list;
  avl_init(&_domain_metrics,avl_comp_strcasecmp,0);
  avl_init(&_domain_mprs,avl_comp_strcasecmp,0);
  _flooding_domain.metric = &_no_metric;
  _everyone_mprs._refcount = _everyone_mprs._refcount + 1;
  _flooding_domain.mpr = &_everyone_mprs;
  _no_metric._refcount = _no_metric._refcount + 1;
  return;
}

Assistant:

void
nhdp_domain_init(struct oonf_rfc5444_protocol *p) {
  _protocol = p;

  oonf_class_add(&_domain_class);
  list_init_head(&_domain_list);
  list_init_head(&_domain_listener_list);
  list_init_head(&_domain_metric_postprocessor_list);

  avl_init(&_domain_metrics, avl_comp_strcasecmp, false);
  avl_init(&_domain_mprs, avl_comp_strcasecmp, false);

  /* initialize flooding domain */
  _flooding_domain.metric = &_no_metric;
  _flooding_domain.mpr = &_everyone_mprs;

  _flooding_domain.mpr->_refcount++;
  _flooding_domain.metric->_refcount++;
}